

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bgzf.c
# Opt level: O2

int bgzf_close(BGZF *fp)

{
  pthread_mutex_t *__mutex;
  uint *__ptr;
  bgzf_mtaux_t *__ptr_00;
  int iVar1;
  ssize_t sVar2;
  int iVar3;
  byte bVar4;
  long lVar5;
  ulong uVar6;
  long lVar7;
  
  iVar3 = -1;
  if (fp == (BGZF *)0x0) {
    return -1;
  }
  if (((undefined1  [96])*fp & (undefined1  [96])0x60000000) != (undefined1  [96])0x0 &&
      ((undefined1  [96])*fp & (undefined1  [96])0x30000) != (undefined1  [96])0x0) {
    iVar1 = bgzf_flush(fp);
    if (iVar1 != 0) {
      return -1;
    }
    *(uint *)fp = *(uint *)fp | 0x1ff00000;
    iVar1 = deflate_block(fp,0);
    sVar2 = hwrite(fp->fp,fp->compressed_block,(long)iVar1);
    if ((sVar2 < 0) || (iVar1 = hflush(fp->fp), iVar1 != 0)) {
      *(byte *)fp = *(byte *)fp | 4;
      return -1;
    }
    __ptr_00 = fp->mt;
    if (__ptr_00 != (bgzf_mtaux_t *)0x0) {
      __mutex = &__ptr_00->lock;
      pthread_mutex_lock((pthread_mutex_t *)__mutex);
      __ptr_00->done = 1;
      __ptr_00->proc_cnt = 0;
      pthread_cond_broadcast((pthread_cond_t *)&__ptr_00->cv);
      pthread_mutex_unlock((pthread_mutex_t *)__mutex);
      for (lVar7 = 1; lVar7 < __ptr_00->n_threads; lVar7 = lVar7 + 1) {
        pthread_join(__ptr_00->tid[lVar7],(void **)0x0);
      }
      for (lVar7 = 0; lVar7 < __ptr_00->n_blks; lVar7 = lVar7 + 1) {
        free(__ptr_00->blk[lVar7]);
      }
      lVar7 = 8;
      for (lVar5 = 0; lVar5 < __ptr_00->n_threads; lVar5 = lVar5 + 1) {
        free(*(void **)((long)&__ptr_00->w->mt + lVar7));
        lVar7 = lVar7 + 0x20;
      }
      free(__ptr_00->blk);
      free(__ptr_00->len);
      free(__ptr_00->w);
      free(__ptr_00->tid);
      pthread_cond_destroy((pthread_cond_t *)&__ptr_00->cv);
      pthread_mutex_destroy((pthread_mutex_t *)__mutex);
      free(__ptr_00);
    }
  }
  if ((int)*(uint *)fp < 0) {
    if ((*(uint *)fp & 0x30000) == 0) {
      inflateEnd(fp->gz_stream);
    }
    else {
      deflateEnd();
    }
    free(fp->gz_stream);
  }
  iVar1 = hclose(fp->fp);
  if (iVar1 == 0) {
    bgzf_index_destroy(fp);
    free(fp->uncompressed_block);
    free(fp->compressed_block);
    if ((fp->field_0x2 & 3) == 0) {
      __ptr = (uint *)fp->cache;
      lVar7 = 4;
      bVar4 = 0;
      for (uVar6 = 0; uVar6 < *__ptr; uVar6 = uVar6 + 1) {
        if ((*(uint *)(*(long *)(__ptr + 4) + (uVar6 >> 4) * 4) >> (bVar4 & 0x1e) & 3) == 0) {
          free(*(void **)(*(long *)(__ptr + 8) + lVar7 * 2));
        }
        lVar7 = lVar7 + 0xc;
        bVar4 = bVar4 + 2;
      }
      free(*(void **)(__ptr + 6));
      free(*(void **)(__ptr + 4));
      free(*(void **)(__ptr + 8));
      free(__ptr);
    }
    free(fp);
    iVar3 = 0;
  }
  return iVar3;
}

Assistant:

int bgzf_close(BGZF* fp)
{
    int ret, block_length;
    if (fp == 0) return -1;
    if (fp->is_write && fp->is_compressed) {
        if (bgzf_flush(fp) != 0) return -1;
        fp->compress_level = -1;
        block_length = deflate_block(fp, 0); // write an empty block
        if (hwrite(fp->fp, fp->compressed_block, block_length) < 0
            || hflush(fp->fp) != 0) {
            fp->errcode |= BGZF_ERR_IO;
            return -1;
        }
#ifdef BGZF_MT
        if (fp->mt) mt_destroy(fp->mt);
#endif
    }
    if ( fp->is_gzip )
    {
        if (!fp->is_write) (void)inflateEnd(fp->gz_stream);
        else (void)deflateEnd(fp->gz_stream);
        free(fp->gz_stream);
    }
    ret = hclose(fp->fp);
    if (ret != 0) return -1;
    bgzf_index_destroy(fp);
    free(fp->uncompressed_block);
    free(fp->compressed_block);
    free_cache(fp);
    free(fp);
    return 0;
}